

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O3

array<char,_96UL> * libtorrent::aux::export_key(array<char,_96UL> *__return_storage_ptr__,key_t *k)

{
  int iVar1;
  array<char,_96UL> *paVar2;
  
  paVar2 = (array<char,_96UL> *)
           boost::multiprecision::
           export_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
                     (k,(uchar *)__return_storage_ptr__,8,true);
  if (paVar2 < __return_storage_ptr__ + 1) {
    iVar1 = (int)paVar2 - (int)__return_storage_ptr__;
    memmove((void *)((long)(__return_storage_ptr__ + 1) - (long)iVar1),__return_storage_ptr__,
            (long)iVar1);
    memset(__return_storage_ptr__,0,(long)(0x60 - iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<char, 96> export_key(key_t const& k)
	{
		std::array<char, 96> ret;
		auto* begin = reinterpret_cast<std::uint8_t*>(ret.data());
		std::uint8_t* end = mp::export_bits(k, begin, 8);

		// TODO: it would be nice to be able to export to a fixed width field, so
		// we wouldn't have to shift it later
		if (end < begin + 96)
		{
			int const len = int(end - begin);
#if defined __GNUC__ && __GNUC__ == 12
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-overflow"
#endif
			std::memmove(begin + 96 - len, begin, aux::numeric_cast<std::size_t>(len));
#if defined __GNUC__ && __GNUC__ == 12
#pragma GCC diagnostic pop
#endif
			std::memset(begin, 0, aux::numeric_cast<std::size_t>(96 - len));
		}
		return ret;
	}